

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_layer_weights(void)

{
  char *pcVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  int i;
  int length;
  ofstream fout_weights;
  string file_name;
  vector<double,_std::allocator<double>_> weights;
  int local_290;
  ostream local_288 [8];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  OutputIterations *in_stack_fffffffffffffe18;
  string local_88 [48];
  string local_58 [32];
  string local_38 [32];
  vector<double,_std::allocator<double>_> local_18;
  
  calculate_global_layer_weights();
  if (mpi_rank == 0) {
    std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    OutputIterations::get_current_iteration_string_abi_cxx11_(in_stack_fffffffffffffe18);
    std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_58);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_288,pcVar1,_S_out);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&local_18);
    for (local_290 = 0; local_290 < (int)sVar2; local_290 = local_290 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_18,(long)local_290);
      poVar4 = (ostream *)std::ostream::operator<<(local_288,*pvVar3);
      std::operator<<(poVar4,"\n");
    }
    std::ofstream::~ofstream(local_288);
    std::__cxx11::string::~string(local_38);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  return;
}

Assistant:

void write_layer_weights() {
    auto weights = calculate_global_layer_weights();

    if (mpi_rank == 0) {
        const std::string file_name = data_folder + "/weights" + output_iterations.get_current_iteration_string();

        ofstream fout_weights(file_name.c_str(), ios_base::out);

        int length = weights.size();
        for (int i = 0; i < length; i++) {
            fout_weights << weights[i] << "\n";
        }
    }
}